

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

void Gia_ManHashStart(Gia_Man_t *p)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  Gia_ManHashAlloc(p);
  if (0 < p->nObjs) {
    iVar8 = 0;
    lVar9 = 0;
    lVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar1 = *(ulong *)(&p->pObjs->field_0x0 + lVar9);
      uVar3 = (uint)uVar1;
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        iVar6 = (int)lVar7;
        if ((int)(iVar6 - (uVar3 & 0x1fffffff)) < 0) {
LAB_002098d4:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar5 = (uint)(uVar1 >> 0x20) & 0x1fffffff;
        if ((int)(iVar6 - uVar5) < 0) goto LAB_002098d4;
        if (p->pMuxes == (uint *)0x0) {
          uVar4 = 0xffffffff;
        }
        else {
          uVar4 = p->pMuxes[lVar7];
          uVar4 = -(uint)(uVar4 == 0) | uVar4;
        }
        piVar2 = Gia_ManHashFind(p,iVar8 + (uint)((uVar3 >> 0x1d & 1) != 0) +
                                   (uVar3 & 0x1fffffff) * -2,
                                 iVar8 + (uint)((uVar1 >> 0x3d & 1) != 0) + uVar5 * -2,uVar4);
        if (*piVar2 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                        ,0x85,"void Gia_ManHashStart(Gia_Man_t *)");
        }
        *piVar2 = iVar6;
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0xc;
      iVar8 = iVar8 + 2;
    } while (lVar7 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManHashStart( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int * pPlace, i;
    Gia_ManHashAlloc( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pObj, i), Gia_ObjFaninLit1(pObj, i), Gia_ObjFaninLit2(p, i) );
        assert( *pPlace == 0 );
        *pPlace = i;
    }
}